

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DeviceWaitForFence
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IFence *pFence,Uint64 Value,
          int param_3)

{
  int iVar1;
  undefined4 extraout_var;
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == true) {
    FormatString<char[48]>
              (&local_30,(char (*) [48])"Fence can only be waited from immediate context");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"DeviceWaitForFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ab);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (pFence == (IFence *)0x0) {
    FormatString<char[23]>(&local_30,(char (*) [23])0x5adeba);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"DeviceWaitForFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ac);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = (*(pFence->super_IDeviceObject).super_IObject._vptr_IObject[4])(pFence);
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 8) != '\x01') {
    FormatString<char[46]>(&local_30,(char (*) [46])"Fence must be created with FENCE_TYPE_GENERAL")
    ;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"DeviceWaitForFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ad);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DeviceWaitForFence(IFence* pFence, Uint64 Value, int)
{
    DEV_CHECK_ERR(!IsDeferred(), "Fence can only be waited from immediate context");
    DEV_CHECK_ERR(pFence, "Fence must not be null");
    DEV_CHECK_ERR(pFence->GetDesc().Type == FENCE_TYPE_GENERAL, "Fence must be created with FENCE_TYPE_GENERAL");
}